

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::ThinDielectricMaterial::~ThinDielectricMaterial(ThinDielectricMaterial *this)

{
  ~ThinDielectricMaterial((ThinDielectricMaterial *)0x1a65c8);
  SceneGraph::MaterialNode::operator_delete((void *)0x1a65d2);
  return;
}

Assistant:

struct PREFIX(ThinDielectricMaterial) MATERIAL_BASE_CLASS
  {
#if !defined(ISPC) && !defined(CPPTUTORIAL)
    ThinDielectricMaterial (const Vec3fa& transmission, const float eta, const float thickness)
      : base(MATERIAL_THIN_DIELECTRIC), transmission(transmission), transmissionFactor(log(transmission)*thickness), eta(eta), thickness(thickness) {}
    virtual Material* material() { return &base; }
#endif

    PREFIX(Material) base;
    Vec3fa transmission;
    Vec3fa transmissionFactor;
    float eta;
    float thickness;
  }